

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void clockOff(HighsMipAnalysis *analysis)

{
  bool bVar1;
  uint mip_clock;
  uint uVar2;
  uint uVar3;
  HighsMipAnalysis *in_RDI;
  bool one_running;
  int clock2_running;
  int clock1_running;
  int clock0_running;
  HighsInt in_stack_0000002c;
  HighsMipAnalysis *in_stack_00000030;
  HighsInt in_stack_fffffffffffffff4;
  
  if ((in_RDI->analyse_mip_time & 1U) != 0) {
    bVar1 = HighsMipAnalysis::mipTimerRunning(in_RDI,in_stack_fffffffffffffff4);
    mip_clock = (uint)bVar1;
    bVar1 = HighsMipAnalysis::mipTimerRunning(in_RDI,mip_clock);
    uVar2 = (uint)bVar1;
    bVar1 = HighsMipAnalysis::mipTimerRunning(in_RDI,mip_clock);
    uVar3 = (uint)bVar1;
    if (mip_clock + uVar2 + uVar3 == 0) {
      printf("HighsMipSolverData::clockOff Clocks running are (%d; %d; %d)\n",(ulong)mip_clock,
             (ulong)uVar2,(ulong)uVar3);
    }
    if (mip_clock != 0) {
      HighsMipAnalysis::mipTimerStop(in_stack_00000030,in_stack_0000002c);
    }
    if (uVar2 != 0) {
      HighsMipAnalysis::mipTimerStop(in_stack_00000030,in_stack_0000002c);
    }
    if (uVar3 != 0) {
      HighsMipAnalysis::mipTimerStop(in_stack_00000030,in_stack_0000002c);
    }
  }
  return;
}

Assistant:

void clockOff(HighsMipAnalysis& analysis) {
  if (!analysis.analyse_mip_time) return;
  // Make sure that exactly one of the following clocks is running
  const int clock0_running =
      analysis.mipTimerRunning(kMipClockEvaluateRootNode0) ? 1 : 0;
  const int clock1_running =
      analysis.mipTimerRunning(kMipClockEvaluateRootNode1) ? 1 : 0;
  const int clock2_running =
      analysis.mipTimerRunning(kMipClockEvaluateRootNode2) ? 1 : 0;
  const bool one_running = clock0_running + clock1_running + clock2_running;
  if (!one_running)
    printf("HighsMipSolverData::clockOff Clocks running are (%d; %d; %d)\n",
           clock0_running, clock1_running, clock2_running);
  assert(one_running);
  if (clock0_running) analysis.mipTimerStop(kMipClockEvaluateRootNode0);
  if (clock1_running) analysis.mipTimerStop(kMipClockEvaluateRootNode1);
  if (clock2_running) analysis.mipTimerStop(kMipClockEvaluateRootNode2);
}